

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

void duckdb::QuantileOperation::
     ConstantOperation<duckdb::date_t,duckdb::QuantileState<duckdb::date_t,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<duckdb::timestamp_t,false>>
               (QuantileState<duckdb::date_t,_duckdb::QuantileStandardType> *state,date_t *input,
               AggregateUnaryInput *unary_input,idx_t count)

{
  AggregateUnaryInput *in_RCX;
  date_t *in_RDX;
  QuantileState<duckdb::date_t,_duckdb::QuantileStandardType> *in_RSI;
  idx_t i;
  AggregateUnaryInput *local_28;
  
  for (local_28 = (AggregateUnaryInput *)0x0; local_28 < in_RCX;
      local_28 = (AggregateUnaryInput *)((long)&local_28->input + 1)) {
    Operation<duckdb::date_t,duckdb::QuantileState<duckdb::date_t,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<duckdb::timestamp_t,false>>
              (in_RSI,in_RDX,in_RCX);
  }
  return;
}

Assistant:

static void ConstantOperation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input,
	                              idx_t count) {
		for (idx_t i = 0; i < count; i++) {
			Operation<INPUT_TYPE, STATE, OP>(state, input, unary_input);
		}
	}